

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

int main_average(void)

{
  double dVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  vector<double,_std::allocator<double>_> data;
  vector<double,_std::allocator<double>_> output;
  FC_BPNN bp;
  allocator_type local_13a;
  allocator_type local_139;
  vector<double,_std::allocator<double>_> local_138;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  vector<double,_std::allocator<double>_> local_d8;
  double local_b8;
  double local_b0;
  vector<double,_std::allocator<double>_> local_a8;
  vector<double,_std::allocator<double>_> local_90;
  FC_BPNN local_78;
  
  FC_BPNN::FC_BPNN(&local_78,4,10,1);
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_108 = 0.251;
  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
            (&local_138,(iterator)0x0,&local_108);
  local_108 = 0.425;
  if (local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&local_138,
               (iterator)
               local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_108);
  }
  else {
    *local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0.425;
    local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_108 = 0.775;
  if (local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&local_138,
               (iterator)
               local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_108);
  }
  else {
    *local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0.775;
    local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_108 = 0.952;
  if (local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&local_138,
               (iterator)
               local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_108);
  }
  else {
    *local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0.952;
    local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar4 = 1;
  local_118 = 0.0;
  do {
    iVar2 = rand();
    local_110 = (double)(iVar2 % 1000) / 1000.0;
    iVar2 = rand();
    local_e0 = (double)(iVar2 % 1000) / 1000.0;
    iVar2 = rand();
    local_e8 = (double)(iVar2 % 1000) / 1000.0;
    iVar2 = rand();
    local_f0 = (double)(iVar2 % 1000) / 1000.0;
    local_108 = local_110;
    local_100 = local_e0;
    local_f8 = local_e8;
    __l._M_len = 4;
    __l._M_array = &local_108;
    local_b8 = local_f0;
    std::vector<double,_std::allocator<double>_>::vector(&local_90,__l,&local_139);
    local_b0 = (local_110 + local_e0 + local_e8 + local_b8) * 0.25;
    __l_00._M_len = 1;
    __l_00._M_array = &local_b0;
    std::vector<double,_std::allocator<double>_>::vector(&local_a8,__l_00,&local_13a);
    local_110 = FC_BPNN::train_once(&local_78,&local_90,&local_a8);
    if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    iVar2 = (int)uVar4;
    local_118 = local_118 + local_110;
    if ((int)(uVar4 / 10) * -10 + 1 + iVar2 == 1) {
      local_118 = local_118 / 10.0;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"iter: ",6);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," cost: ",7);
      poVar3 = std::ostream::_M_insert<double>(local_118);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," step: ",7);
      dVar1 = FC_BPNN::getLearningStep(&local_78);
      poVar3 = std::ostream::_M_insert<double>(dVar1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      local_118 = 0.0;
      std::ostream::flush();
    }
    uVar4 = (ulong)(iVar2 + 1U);
  } while (iVar2 + 1U != 0x65);
  FC_BPNN::predict(&local_78,&local_138,&local_d8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"prediction: ",0xc);
  poVar3 = std::ostream::_M_insert<double>
                     (*local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," gt: ",5);
  poVar3 = std::ostream::_M_insert<double>
                     ((*local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start +
                       local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[1] +
                       local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[2] +
                      local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[3]) * 0.25);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  FC_BPNN::~FC_BPNN(&local_78);
  return 1;
}

Assistant:

int main_average() {
	FC_BPNN bp(4, 10, 1);
	std::vector<double> data; data.push_back(0.251); data.push_back(0.425); data.push_back(0.775); data.push_back(0.952);
	std::vector<double> output;
	double lastCost = 0.0; double cost = 0.0;
	for (int i = 1; i <= 100; i++) {
		double a = (double)(rand() % 1000) / 1000;
		double b = (double)(rand() % 1000) / 1000;
		double c = (double)(rand() % 1000) / 1000;
		double d = (double)(rand() % 1000) / 1000;
		cost += bp.train_once({ a ,b, c,d }, { average4(a,b,c,d) });
		if (i % 10 == 0) {
			cost /= 10;
			std::cout << "iter: " << i << " cost: " << cost << " step: " << bp.getLearningStep() << std::endl;
			lastCost = cost;
			cost = 0.0;
		}
	}
	bp.predict(data, output);
	std::cout << "prediction: " << output[0] << " gt: " << average4(data[0], data[1], data[2], data[3]) << std::endl;
	return 1;
}